

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1-client.c
# Opt level: O1

void ssh1mainchan_request_x11_forwarding
               (SshChannel *sc,_Bool want_reply,char *authproto,char *authdata,int screen_number,
               _Bool oneshot)

{
  BinarySink *bs;
  long lVar1;
  code *handler;
  
  lVar1 = (*(code *)((sc[0xd].cl)->logctx->queue).tail)(0x22);
  bs = (BinarySink *)(lVar1 + 0x60);
  BinarySink_put_stringz(bs,authproto);
  BinarySink_put_stringz(bs,authdata);
  if (((ulong)sc[-1].vt & 1) != 0) {
    BinarySink_put_uint32(bs,(long)screen_number);
  }
  pq_base_push((PacketQueueBase *)sc[0xe].cl,(PacketQueueNode *)(lVar1 + 0x40));
  handler = ssh1mainchan_succfail_nowantreply;
  if (want_reply) {
    handler = ssh1mainchan_succfail_wantreply;
  }
  ssh1_queue_succfail_handler((ssh1_connection_state *)(sc + -2),handler,(void *)0x0,false);
  return;
}

Assistant:

static void ssh1mainchan_request_x11_forwarding(
    SshChannel *sc, bool want_reply, const char *authproto,
    const char *authdata, int screen_number, bool oneshot)
{
    struct ssh1_connection_state *s =
        container_of(sc, struct ssh1_connection_state, mainchan_sc);
    PktOut *pktout;

    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_CMSG_X11_REQUEST_FORWARDING);
    put_stringz(pktout, authproto);
    put_stringz(pktout, authdata);
    if (s->local_protoflags & SSH1_PROTOFLAG_SCREEN_NUMBER)
        put_uint32(pktout, screen_number);
    pq_push(s->ppl.out_pq, pktout);

    ssh1mainchan_queue_response(s, want_reply, false);
}